

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O1

bool __thiscall
ithipublisher::GetCurrent(ithipublisher *this,char *metric_name,char *key_value,double *current)

{
  vector<double,_std::allocator<double>_> val;
  vector<double,_std::allocator<double>_> local_28;
  
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  GetVector(this,metric_name,key_value,&local_28);
  *current = local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[(long)this->nb_months + -1];
  if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool ithipublisher::GetCurrent(char const * metric_name, char const * key_value, double * current)
{
    std::vector<double> val;
    bool ret = GetVector(metric_name, key_value, &val);

    *current = val[((size_t)nb_months) - 1];

    return ret;
}